

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<float,_1,_0>::calcPartialsPartials
          (BeagleCPU4StateImpl<float,_1,_0> *this,float *destP,float *partials1,float *matrices1,
          float *partials2,float *matrices2,int startPattern,int endPattern)

{
  uint uVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  float fVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  float fVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  float fVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  float fVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  float fVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  float fVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  float fVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  float fVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  float fVar38;
  uint uVar39;
  uint uVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  int iVar49;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  float m202;
  float m201;
  float m200;
  float m133;
  float m132;
  float m131;
  float m130;
  float m123;
  float m122;
  float m121;
  float m120;
  float m113;
  float m112;
  float m111;
  float m110;
  float m103;
  float m102;
  float m101;
  float m100;
  int w;
  int u;
  int l;
  undefined4 local_c0;
  float sum23;
  float sum22;
  float sum21;
  float sum20;
  float sum13;
  float sum12;
  float sum11;
  float sum10;
  float p23;
  float p22;
  float p21;
  float p20;
  float p13;
  float p12;
  float p11;
  float p10;
  int k;
  float m233;
  float m232;
  float m231;
  float m230;
  float m223;
  float m222;
  float m221;
  float m220;
  float m213;
  float m212;
  float m211;
  float m210;
  float m203;
  
  for (m233 = 0.0; (int)m233 < *(int *)(in_RDI + 0x34); m233 = (float)((int)m233 + 1)) {
    k = (int)m233 * 4 * *(int *)(in_RDI + 0x18);
    if (m200 != 0.0) {
      k = (int)m200 * 4 + k;
    }
    iVar49 = (int)m233 * 0x14;
    uVar1 = *(uint *)(in_RCX + (long)iVar49 * 4);
    fVar2 = *(float *)(in_RCX + (long)(iVar49 + 1) * 4);
    uVar3 = *(uint *)(in_RCX + (long)(iVar49 + 2) * 4);
    uVar4 = *(uint *)(in_RCX + (long)(iVar49 + 3) * 4);
    uVar5 = *(uint *)(in_RCX + (long)(iVar49 + 5) * 4);
    fVar6 = *(float *)(in_RCX + (long)(iVar49 + 6) * 4);
    uVar7 = *(uint *)(in_RCX + (long)(iVar49 + 7) * 4);
    uVar8 = *(uint *)(in_RCX + (long)(iVar49 + 8) * 4);
    uVar9 = *(uint *)(in_RCX + (long)(iVar49 + 10) * 4);
    fVar10 = *(float *)(in_RCX + (long)(iVar49 + 0xb) * 4);
    uVar11 = *(uint *)(in_RCX + (long)(iVar49 + 0xc) * 4);
    uVar12 = *(uint *)(in_RCX + (long)(iVar49 + 0xd) * 4);
    uVar13 = *(uint *)(in_RCX + (long)(iVar49 + 0xf) * 4);
    fVar14 = *(float *)(in_RCX + (long)(iVar49 + 0x10) * 4);
    uVar15 = *(uint *)(in_RCX + (long)(iVar49 + 0x11) * 4);
    uVar16 = *(uint *)(in_RCX + (long)(iVar49 + 0x12) * 4);
    uVar17 = *(uint *)(in_R9 + (long)iVar49 * 4);
    fVar18 = *(float *)(in_R9 + (long)(iVar49 + 1) * 4);
    uVar19 = *(uint *)(in_R9 + (long)(iVar49 + 2) * 4);
    uVar20 = *(uint *)(in_R9 + (long)(iVar49 + 3) * 4);
    uVar21 = *(uint *)(in_R9 + (long)(iVar49 + 5) * 4);
    fVar22 = *(float *)(in_R9 + (long)(iVar49 + 6) * 4);
    uVar23 = *(uint *)(in_R9 + (long)(iVar49 + 7) * 4);
    uVar24 = *(uint *)(in_R9 + (long)(iVar49 + 8) * 4);
    uVar25 = *(uint *)(in_R9 + (long)(iVar49 + 10) * 4);
    fVar26 = *(float *)(in_R9 + (long)(iVar49 + 0xb) * 4);
    uVar27 = *(uint *)(in_R9 + (long)(iVar49 + 0xc) * 4);
    uVar28 = *(uint *)(in_R9 + (long)(iVar49 + 0xd) * 4);
    uVar29 = *(uint *)(in_R9 + (long)(iVar49 + 0xf) * 4);
    fVar30 = *(float *)(in_R9 + (long)(iVar49 + 0x10) * 4);
    uVar31 = *(uint *)(in_R9 + (long)(iVar49 + 0x11) * 4);
    uVar32 = *(uint *)(in_R9 + (long)(iVar49 + 0x12) * 4);
    for (local_c0 = m200; (int)local_c0 < (int)m132; local_c0 = (float)((int)local_c0 + 1)) {
      uVar33 = *(uint *)(in_RDX + (long)k * 4);
      fVar34 = *(float *)(in_RDX + (long)(k + 1) * 4);
      uVar35 = *(uint *)(in_RDX + (long)(k + 2) * 4);
      uVar36 = *(uint *)(in_RDX + (long)(k + 3) * 4);
      uVar37 = *(uint *)(in_R8 + (long)k * 4);
      fVar38 = *(float *)(in_R8 + (long)(k + 1) * 4);
      uVar39 = *(uint *)(in_R8 + (long)(k + 2) * 4);
      uVar40 = *(uint *)(in_R8 + (long)(k + 3) * 4);
      auVar41 = vfmadd213ss_fma(ZEXT416(uVar33),ZEXT416(uVar1),ZEXT416((uint)(fVar2 * fVar34)));
      auVar41 = vfmadd213ss_fma(ZEXT416(uVar35),ZEXT416(uVar3),auVar41);
      auVar41 = vfmadd213ss_fma(ZEXT416(uVar36),ZEXT416(uVar4),auVar41);
      auVar42 = vfmadd213ss_fma(ZEXT416(uVar33),ZEXT416(uVar5),ZEXT416((uint)(fVar6 * fVar34)));
      auVar42 = vfmadd213ss_fma(ZEXT416(uVar35),ZEXT416(uVar7),auVar42);
      auVar42 = vfmadd213ss_fma(ZEXT416(uVar36),ZEXT416(uVar8),auVar42);
      auVar43 = vfmadd213ss_fma(ZEXT416(uVar33),ZEXT416(uVar9),ZEXT416((uint)(fVar10 * fVar34)));
      auVar43 = vfmadd213ss_fma(ZEXT416(uVar35),ZEXT416(uVar11),auVar43);
      auVar43 = vfmadd213ss_fma(ZEXT416(uVar36),ZEXT416(uVar12),auVar43);
      auVar44 = vfmadd213ss_fma(ZEXT416(uVar33),ZEXT416(uVar13),ZEXT416((uint)(fVar14 * fVar34)));
      auVar44 = vfmadd213ss_fma(ZEXT416(uVar35),ZEXT416(uVar15),auVar44);
      auVar44 = vfmadd213ss_fma(ZEXT416(uVar36),ZEXT416(uVar16),auVar44);
      auVar45 = vfmadd213ss_fma(ZEXT416(uVar37),ZEXT416(uVar17),ZEXT416((uint)(fVar18 * fVar38)));
      auVar45 = vfmadd213ss_fma(ZEXT416(uVar39),ZEXT416(uVar19),auVar45);
      auVar45 = vfmadd213ss_fma(ZEXT416(uVar40),ZEXT416(uVar20),auVar45);
      auVar46 = vfmadd213ss_fma(ZEXT416(uVar37),ZEXT416(uVar21),ZEXT416((uint)(fVar22 * fVar38)));
      auVar46 = vfmadd213ss_fma(ZEXT416(uVar39),ZEXT416(uVar23),auVar46);
      auVar46 = vfmadd213ss_fma(ZEXT416(uVar40),ZEXT416(uVar24),auVar46);
      auVar47 = vfmadd213ss_fma(ZEXT416(uVar37),ZEXT416(uVar25),ZEXT416((uint)(fVar26 * fVar38)));
      auVar47 = vfmadd213ss_fma(ZEXT416(uVar39),ZEXT416(uVar27),auVar47);
      auVar47 = vfmadd213ss_fma(ZEXT416(uVar40),ZEXT416(uVar28),auVar47);
      auVar48 = vfmadd213ss_fma(ZEXT416(uVar37),ZEXT416(uVar29),ZEXT416((uint)(fVar30 * fVar38)));
      auVar48 = vfmadd213ss_fma(ZEXT416(uVar39),ZEXT416(uVar31),auVar48);
      auVar48 = vfmadd213ss_fma(ZEXT416(uVar40),ZEXT416(uVar32),auVar48);
      *(float *)(in_RSI + (long)k * 4) = auVar41._0_4_ * auVar45._0_4_;
      *(float *)(in_RSI + (long)(k + 1) * 4) = auVar42._0_4_ * auVar46._0_4_;
      *(float *)(in_RSI + (long)(k + 2) * 4) = auVar43._0_4_ * auVar47._0_4_;
      *(float *)(in_RSI + (long)(k + 3) * 4) = auVar44._0_4_ * auVar48._0_4_;
      k = k + 4;
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcPartialsPartials(REALTYPE* destP,
                                                                   const REALTYPE* partials1,
                                                                   const REALTYPE* matrices1,
                                                                   const REALTYPE* partials2,
                                                                   const REALTYPE* matrices2,
                                                                   int startPattern,
                                                                   int endPattern) {


#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int u = l*4*kPaddedPatternCount;
        if (startPattern != 0) {
          u += 4*startPattern;
        }
        int w = l*4*OFFSET;

        PREFETCH_MATRIX(1,matrices1,w);
        PREFETCH_MATRIX(2,matrices2,w);
        for (int k = startPattern; k < endPattern; k++) {
            PREFETCH_PARTIALS(1,partials1,u);
            PREFETCH_PARTIALS(2,partials2,u);

            DO_INTEGRATION(1); // defines sum10, sum11, sum12, sum13
            DO_INTEGRATION(2); // defines sum20, sum21, sum22, sum23

            // Final results
            destP[u    ] = sum10 * sum20;
            destP[u + 1] = sum11 * sum21;
            destP[u + 2] = sum12 * sum22;
            destP[u + 3] = sum13 * sum23;

            u += 4;

        }
    }
}